

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

int TVMStreamFree(int device_type,int device_id,TVMStreamHandle stream)

{
  DeviceAPI *pDVar1;
  runtime_error *_except_;
  TVMContext local_28;
  TVMContext ctx;
  TVMStreamHandle stream_local;
  int device_id_local;
  int device_type_local;
  
  local_28.device_type = device_type;
  local_28.device_id = device_id;
  ctx = (TVMContext)stream;
  pDVar1 = tvm::runtime::DeviceAPIManager::Get(&local_28);
  (*pDVar1->_vptr_DeviceAPI[8])(pDVar1,CONCAT44(local_28.device_id,local_28.device_type),ctx);
  return 0;
}

Assistant:

int TVMStreamFree(int device_type, int device_id, TVMStreamHandle stream) {
  API_BEGIN();
  TVMContext ctx;
  ctx.device_type = static_cast<DLDeviceType>(device_type);
  ctx.device_id = device_id;
  DeviceAPIManager::Get(ctx)->FreeStream(ctx, stream);
  API_END();
}